

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerHLSL::emit_builtin_variables(CompilerHLSL *this)

{
  __hashtable_alloc *p_Var1;
  Bitset *pBVar2;
  undefined8 uVar3;
  __hashtable *__h;
  uint32_t i;
  _Hash_node_base *p_Var4;
  ulong uVar5;
  __node_base _Var6;
  long lVar7;
  long lVar8;
  bool need_base_vertex_info;
  __alloc_node_gen_t __alloc_node_gen;
  Bitset builtins;
  bool local_b9;
  undefined1 local_b8 [56];
  anon_class_16_2_7737ed71 local_80;
  ulong local_70;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_70 = (this->super_CompilerGLSL).super_Compiler.active_input_builtins.lower;
  local_68._M_buckets = (__buckets_ptr)0x0;
  local_68._M_bucket_count =
       (this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h._M_bucket_count;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count =
       (this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h._M_element_count;
  pBVar2 = &(this->super_CompilerGLSL).super_Compiler.active_input_builtins;
  local_68._M_rehash_policy._M_max_load_factor =
       (pBVar2->higher)._M_h._M_rehash_policy._M_max_load_factor;
  local_68._M_rehash_policy._4_4_ = *(undefined4 *)&(pBVar2->higher)._M_h._M_rehash_policy.field_0x4
  ;
  local_68._M_rehash_policy._M_next_resize =
       (this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h._M_rehash_policy.
       _M_next_resize;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_b8._0_8_ = &local_68;
  ::std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_68,
             &(this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,_false>_>_> *)
             local_b8);
  local_70 = local_70 | (this->super_CompilerGLSL).super_Compiler.active_output_builtins.lower;
  p_Var4 = (this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher._M_h.
           _M_before_begin._M_nxt;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    do {
      local_b8._0_8_ = &local_68;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_68,p_Var4 + 1,local_b8);
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  local_80.need_base_vertex_info = &local_b9;
  local_b9 = false;
  uVar5 = 0;
  local_80.this = this;
  do {
    if ((local_70 >> (uVar5 & 0x3f) & 1) != 0) {
      emit_builtin_variables::anon_class_16_2_7737ed71::operator()(&local_80,(uint32_t)uVar5);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x40);
  if (local_68._M_element_count != 0) {
    local_b8._0_8_ = local_b8 + 0x18;
    local_b8._8_8_ = 0;
    local_b8._16_8_ = 8;
    SmallVector<unsigned_int,_8UL>::reserve
              ((SmallVector<unsigned_int,_8UL> *)local_b8,local_68._M_element_count);
    if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      _Var6._M_nxt = local_68._M_before_begin._M_nxt;
      do {
        SmallVector<unsigned_int,_8UL>::reserve
                  ((SmallVector<unsigned_int,_8UL> *)local_b8,local_b8._8_8_ + 1);
        *(undefined4 *)(local_b8._0_8_ + local_b8._8_8_ * 4) =
             *(undefined4 *)&_Var6._M_nxt[1]._M_nxt;
        local_b8._8_8_ = local_b8._8_8_ + 1;
        _Var6._M_nxt = (_Var6._M_nxt)->_M_nxt;
      } while (_Var6._M_nxt != (_Hash_node_base *)0x0);
    }
    uVar3 = local_b8._0_8_;
    if (local_b8._8_8_ != 0) {
      p_Var1 = (__hashtable_alloc *)(local_b8._0_8_ + local_b8._8_8_ * 4);
      lVar7 = 0x3f;
      if (local_b8._8_8_ != 0) {
        for (; (ulong)local_b8._8_8_ >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      ::std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_b8._0_8_,p_Var1,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
      ::std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>(uVar3,p_Var1);
    }
    uVar3 = local_b8._0_8_;
    if (local_b8._8_8_ != 0) {
      lVar7 = local_b8._8_8_ << 2;
      lVar8 = 0;
      do {
        emit_builtin_variables::anon_class_16_2_7737ed71::operator()
                  (&local_80,*(uint32_t *)(uVar3 + lVar8));
        lVar8 = lVar8 + 4;
      } while (lVar7 != lVar8);
    }
    local_b8._8_8_ = 0;
    if ((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
         *)local_b8._0_8_ !=
        (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
         *)(local_b8 + 0x18)) {
      free((void *)local_b8._0_8_);
    }
  }
  if (local_b9 == true) {
    CompilerGLSL::statement<char_const(&)[31]>
              (&this->super_CompilerGLSL,(char (*) [31])"cbuffer SPIRV_Cross_VertexInfo");
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[28]>(&this->super_CompilerGLSL,(char (*) [28])0x2e47b1);
    CompilerGLSL::statement<char_const(&)[30]>(&this->super_CompilerGLSL,(char (*) [30])0x2e475b);
    CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2dc0a8);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void CompilerHLSL::emit_builtin_variables()
{
	Bitset builtins = active_input_builtins;
	builtins.merge_or(active_output_builtins);

	bool need_base_vertex_info = false;

	// Emit global variables for the interface variables which are statically used by the shader.
	builtins.for_each_bit([&](uint32_t i) {
		const char *type = nullptr;
		auto builtin = static_cast<BuiltIn>(i);
		uint32_t array_size = 0;

		switch (builtin)
		{
		case BuiltInFragCoord:
		case BuiltInPosition:
			type = "float4";
			break;

		case BuiltInFragDepth:
			type = "float";
			break;

		case BuiltInVertexId:
		case BuiltInVertexIndex:
		case BuiltInInstanceIndex:
			type = "int";
			if (hlsl_options.support_nonzero_base_vertex_base_instance)
				need_base_vertex_info = true;
			break;

		case BuiltInInstanceId:
		case BuiltInSampleId:
			type = "int";
			break;

		case BuiltInPointSize:
			if (hlsl_options.point_size_compat)
			{
				// Just emit the global variable, it will be ignored.
				type = "float";
				break;
			}
			else
				SPIRV_CROSS_THROW(join("Unsupported builtin in HLSL: ", unsigned(builtin)));

		case BuiltInGlobalInvocationId:
		case BuiltInLocalInvocationId:
		case BuiltInWorkgroupId:
			type = "uint3";
			break;

		case BuiltInLocalInvocationIndex:
			type = "uint";
			break;

		case BuiltInFrontFacing:
			type = "bool";
			break;

		case BuiltInNumWorkgroups:
		case BuiltInPointCoord:
			// Handled specially.
			break;

		case BuiltInSubgroupLocalInvocationId:
		case BuiltInSubgroupSize:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("Need SM 6.0 for Wave ops.");
			break;

		case BuiltInSubgroupEqMask:
		case BuiltInSubgroupLtMask:
		case BuiltInSubgroupLeMask:
		case BuiltInSubgroupGtMask:
		case BuiltInSubgroupGeMask:
			if (hlsl_options.shader_model < 60)
				SPIRV_CROSS_THROW("Need SM 6.0 for Wave ops.");
			type = "uint4";
			break;

		case BuiltInClipDistance:
			array_size = clip_distance_count;
			type = "float";
			break;

		case BuiltInCullDistance:
			array_size = cull_distance_count;
			type = "float";
			break;

		case BuiltInSampleMask:
			type = "int";
			break;

		default:
			SPIRV_CROSS_THROW(join("Unsupported builtin in HLSL: ", unsigned(builtin)));
		}

		StorageClass storage = active_input_builtins.get(i) ? StorageClassInput : StorageClassOutput;

		if (type)
		{
			if (array_size)
				statement("static ", type, " ", builtin_to_glsl(builtin, storage), "[", array_size, "];");
			else
				statement("static ", type, " ", builtin_to_glsl(builtin, storage), ";");
		}

		// SampleMask can be both in and out with sample builtin, in this case we have already
		// declared the input variable and we need to add the output one now.
		if (builtin == BuiltInSampleMask && storage == StorageClassInput && this->active_output_builtins.get(i))
		{
			statement("static ", type, " ", this->builtin_to_glsl(builtin, StorageClassOutput), ";");
		}
	});

	if (need_base_vertex_info)
	{
		statement("cbuffer SPIRV_Cross_VertexInfo");
		begin_scope();
		statement("int SPIRV_Cross_BaseVertex;");
		statement("int SPIRV_Cross_BaseInstance;");
		end_scope_decl();
		statement("");
	}
}